

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_canvas.hpp
# Opt level: O0

Sizef __thiscall
plot::RealCanvas<plot::BrailleCanvas>::unmap_size
          (RealCanvas<plot::BrailleCanvas> *this,size_type *s)

{
  GenericPoint<long> local_48;
  undefined1 local_38 [8];
  Size canvas_bounds;
  Sizef sz;
  size_type *s_local;
  RealCanvas<plot::BrailleCanvas> *this_local;
  
  canvas_bounds.y = (long)size(this);
  _local_38 = BrailleCanvas::size(&this->canvas_);
  GenericPoint<long>::GenericPoint(&local_48,1,1);
  GenericPoint<long>::operator-=((GenericPoint<long> *)local_38,&local_48);
  GenericPoint<float>::GenericPoint
            ((GenericPoint<float> *)&this_local,
             ((float)s->x / (float)(long)local_38) * (float)canvas_bounds.y,
             ((float)s->y / (float)canvas_bounds.x) * canvas_bounds.y._4_4_);
  return (Sizef)this_local;
}

Assistant:

Sizef unmap_size(typename Canvas::size_type const& s) const {
        auto sz = this->size();
        auto canvas_bounds = canvas_.size();
        canvas_bounds -= decltype(canvas_bounds){ 1, 1 };
        return {
            float(s.x)/canvas_bounds.x * sz.x,
            float(s.y)/canvas_bounds.y * sz.y
        };
    }